

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_filter.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListFilterBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  BoundLambdaExpression *this_00;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  ScalarFunction *bound_function_00;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> _Var4;
  bool bVar5;
  reference pvVar6;
  pointer pEVar7;
  BoundLambdaExpression *pBVar8;
  BinderException *this_01;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_70;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_68 [4];
  Expression *local_48;
  ScalarFunction *local_40;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_38;
  
  local_40 = bound_function;
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  if (pEVar7[9] == (Expression)0x29) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    pBVar8 = BaseExpression::Cast<duckdb::BoundLambdaExpression>((BaseExpression *)pEVar7);
    this_00 = pBVar8 + 0x58;
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)this_00);
    duckdb::LogicalType::LogicalType((LogicalType *)local_68,BOOLEAN);
    bVar5 = LogicalType::operator!=((LogicalType *)(pEVar7 + 0x38),(LogicalType *)local_68);
    duckdb::LogicalType::~LogicalType((LogicalType *)local_68);
    if (bVar5) {
      local_78._M_head_impl = *(Expression **)this_00;
      *(tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> *)this_00 =
           (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      duckdb::LogicalType::LogicalType((LogicalType *)local_68,BOOLEAN);
      duckdb::BoundCastExpression::AddCastToType(&local_70,context,&local_78,local_68,0);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_68);
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_78._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
      _Var2._M_head_impl = local_70._M_head_impl;
      local_78._M_head_impl = (Expression *)0x0;
      local_70._M_head_impl = (Expression *)0x0;
      _Var1._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           *(tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> *)this_00;
      *(Expression **)this_00 = _Var2._M_head_impl;
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          _Var1._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)_Var1._M_t.
                              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))
                  ();
        if (local_70._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)local_70._M_head_impl + 8))();
        }
      }
    }
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    local_48 = (pvVar6->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    duckdb::BoundCastExpression::AddArrayCastToList(local_68);
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    _Var3._M_head_impl = local_68[0]._M_head_impl;
    local_68[0]._M_head_impl = (Expression *)0x0;
    _Var2._M_head_impl =
         (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)_Var2._M_head_impl + 8))();
    }
    if (local_68[0]._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)local_68[0]._M_head_impl + 8))();
    }
    local_68[0]._M_head_impl = (Expression *)0x0;
    if (local_48 != (Expression *)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
    local_48 = (Expression *)0x0;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    bound_function_00 = local_40;
    LogicalType::operator=((LogicalType *)&local_40->field_0x90,(LogicalType *)(pEVar7 + 0x38));
    _Var4._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    LambdaFunctions::ListLambdaBind
              ((LambdaFunctions *)
               local_38._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
               .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,context,
               bound_function_00,arguments,*(long *)(pBVar8 + 0x78) == 2);
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           _Var4._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)local_68,"Invalid lambda expression!",(allocator *)&local_70);
  duckdb::BinderException::BinderException(this_01,(string *)local_68);
  __cxa_throw(this_01,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> ListFilterBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {

	// the list column and the bound lambda expression
	D_ASSERT(arguments.size() == 2);
	if (arguments[1]->GetExpressionClass() != ExpressionClass::BOUND_LAMBDA) {
		throw BinderException("Invalid lambda expression!");
	}

	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();

	// try to cast to boolean, if the return type of the lambda filter expression is not already boolean
	if (bound_lambda_expr.lambda_expr->return_type != LogicalType::BOOLEAN) {
		auto cast_lambda_expr =
		    BoundCastExpression::AddCastToType(context, std::move(bound_lambda_expr.lambda_expr), LogicalType::BOOLEAN);
		bound_lambda_expr.lambda_expr = std::move(cast_lambda_expr);
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	bound_function.return_type = arguments[0]->return_type;
	auto has_index = bound_lambda_expr.parameter_count == 2;
	return LambdaFunctions::ListLambdaBind(context, bound_function, arguments, has_index);
}